

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::operator[](Value *this,char *key)

{
  reference ppVar1;
  bool bVar2;
  iterator local_60;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_58 [3];
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_38;
  const_iterator it;
  CZString actualKey;
  char *key_local;
  Value *this_local;
  
  bVar2 = true;
  if ((*(ushort *)&this->field_0x8 & 0xff) != 0) {
    bVar2 = (*(ushort *)&this->field_0x8 & 0xff) == 7;
  }
  if (!bVar2) {
    __assert_fail("type_ == nullValue || type_ == objectValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                  ,0x49d,"const Value &Json::Value::operator[](const char *) const");
  }
  if ((*(ushort *)&this->field_0x8 & 0xff) == 0) {
    this_local = (Value *)null;
  }
  else {
    CZString::CZString((CZString *)&it,key,noDuplication);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::find((this->value_).map_,(CZString *)&it);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_38,&local_40);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end((this->value_).map_);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(local_58,&local_60);
    bVar2 = std::operator==(&local_38,local_58);
    if (bVar2) {
      this_local = (Value *)null;
    }
    else {
      ppVar1 = std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*(&local_38);
      this_local = &ppVar1->second;
    }
    CZString::~CZString((CZString *)&it);
  }
  return this_local;
}

Assistant:

const Value &
Value::operator[]( const char *key ) const
{
   JSON_ASSERT( type_ == nullValue  ||  type_ == objectValue );
   if ( type_ == nullValue )
      return null;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
   CZString actualKey( key, CZString::noDuplication );
   ObjectValues::const_iterator it = value_.map_->find( actualKey );
   if ( it == value_.map_->end() )
      return null;
   return (*it).second;
#else
   const Value *value = value_.map_->find( key );
   return value ? *value : null;
#endif
}